

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::BaseBuilder::onDetach(BaseBuilder *this,CodeHolder *code)

{
  Error EVar1;
  BaseEmitter *in_RSI;
  CodeHolder *in_RDI;
  BaseBuilder *unaff_retaddr;
  CodeHolder *zone;
  
  zone = in_RDI;
  BaseBuilder_deletePasses(unaff_retaddr);
  ZoneVectorBase::reset((ZoneVectorBase *)(in_RDI[1]._cpuFeatures._data._bits._data + 1));
  ZoneVectorBase::reset((ZoneVectorBase *)(in_RDI[1]._cpuFeatures._data._bits._data + 3));
  ZoneAllocator::reset((ZoneAllocator *)unaff_retaddr,(Zone *)zone);
  Zone::reset((Zone *)this,code._4_4_);
  Zone::reset((Zone *)this,code._4_4_);
  Zone::reset((Zone *)this,code._4_4_);
  *(undefined1 *)&in_RDI[1]._zone._end = 0;
  in_RDI[1]._logger = (Logger *)0x0;
  in_RDI[1]._errorHandler = (ErrorHandler *)0x0;
  in_RDI[1]._zone._ptr = (uint8_t *)0x0;
  EVar1 = BaseEmitter::onDetach(in_RSI,in_RDI);
  return EVar1;
}

Assistant:

Error BaseBuilder::onDetach(CodeHolder* code) noexcept {
  BaseBuilder_deletePasses(this);
  _sectionNodes.reset();
  _labelNodes.reset();

  _allocator.reset(&_codeZone);
  _codeZone.reset();
  _dataZone.reset();
  _passZone.reset();

  _nodeFlags = NodeFlags::kNone;
  _cursor = nullptr;
  _firstNode = nullptr;
  _lastNode = nullptr;

  return Base::onDetach(code);
}